

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  __type _Var1;
  bool bVar2;
  string *in_RSI;
  uint *in_RDI;
  Entry *res;
  uint pos;
  uint h2;
  uint h1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  uint local_30;
  uint local_2c;
  Entry *local_28;
  
  if (in_RDI[4] == 0) {
    local_28 = (Entry *)0x0;
  }
  else {
    local_30 = DefaultHash::hash(in_RSI);
    local_30 = local_30 % in_RDI[4];
    local_28 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_30 * 0x30);
    if ((uint)(local_28->field_0)._infoData >> 2 == *in_RDI) {
      _Var1 = std::operator==(in_stack_ffffffffffffffb8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_28);
      if (_Var1) {
        if (((local_28->field_0)._infoData & 1U) != 0) {
          local_28 = (Entry *)0x0;
        }
      }
      else if (((uint)(local_28->field_0)._infoData >> 1 & 1) == 0) {
        local_28 = (Entry *)0x0;
      }
      else {
        local_2c = DefaultHash2::hash((string *)0x5dbd4f);
        local_2c = local_2c % in_RDI[4];
        if (local_2c == 0) {
          local_2c = 1;
        }
        do {
          local_30 = (local_30 + local_2c) % in_RDI[4];
          local_28 = (Entry *)(*(long *)(in_RDI + 6) + (ulong)local_30 * 0x30);
          bVar2 = false;
          if ((uint)(local_28->field_0)._infoData >> 2 == *in_RDI) {
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_28,in_stack_ffffffffffffffb8);
          }
        } while (bVar2 != false);
        if ((uint)(local_28->field_0)._infoData >> 2 == *in_RDI) {
          if (((local_28->field_0)._infoData & 1U) != 0) {
            local_28 = (Entry *)0x0;
          }
        }
        else {
          local_28 = (Entry *)0x0;
        }
      }
    }
    else {
      local_28 = (Entry *)0x0;
    }
  }
  return local_28;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }